

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHelpers.hpp
# Opt level: O0

SoapySDRArgInfo * callocArrayType<SoapySDRArgInfo>(size_t length)

{
  SoapySDRArgInfo *this;
  undefined8 uVar1;
  size_t in_RDI;
  SoapySDRArgInfo *out;
  
  this = (SoapySDRArgInfo *)calloc(in_RDI,0x60);
  if (this == (SoapySDRArgInfo *)0x0) {
    uVar1 = __cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc((bad_alloc *)this);
    __cxa_throw(uVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  return this;
}

Assistant:

T *callocArrayType(const size_t length)
{
    auto out = (T *)std::calloc(length, sizeof(T));
    if (out == nullptr) throw std::bad_alloc();
    return out;
}